

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O2

cio_error write_some_double_write_partial
                    (cio_io_stream *io_stream,cio_write_buffer *buf,
                    cio_io_stream_write_handler_t handler,void *handler_context)

{
  cio_write_buffer *pcVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = write_check_buffer_pos;
  if (write_some_fake.call_count < 3) {
    pcVar1 = buf->next;
    if ((buf->data).head.q_len == 0) {
      sVar3 = (pcVar1->data).element.length >> 1;
    }
    else {
      memcpy(write_check_buffer + write_check_buffer_pos,(pcVar1->data).element.field_0.const_data,
             (pcVar1->data).element.length >> 1);
      sVar3 = (pcVar1->data).element.length >> 1;
      write_check_buffer_pos = sVar2 + sVar3;
    }
    (*handler)(io_stream,handler_context,buf,CIO_SUCCESS,sVar3);
  }
  else {
    write_some_all(io_stream,buf,handler,handler_context);
  }
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error write_some_double_write_partial(struct cio_io_stream *io_stream, struct cio_write_buffer *buf, cio_io_stream_write_handler_t handler, void *handler_context)
{
	if (write_some_fake.call_count <= 2) {
		struct cio_write_buffer *wb = buf->next;
		if (cio_write_buffer_get_num_buffer_elements(buf) >= 1) {
			memcpy(&write_check_buffer[write_check_buffer_pos], wb->data.element.const_data, wb->data.element.length / 2);
			write_check_buffer_pos += wb->data.element.length / 2;
		}

		handler(io_stream, handler_context, buf, CIO_SUCCESS, wb->data.element.length / 2);
	} else {
		write_some_all(io_stream, buf, handler, handler_context);
	}

	return CIO_SUCCESS;
}